

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::DepthStencilTests::init(DepthStencilTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dVar2;
  Context *pCVar3;
  _func_int **__s;
  deUint32 *pdVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  deBool dVar8;
  deUint32 dVar9;
  int iVar10;
  TestNode *pTVar11;
  size_t sVar12;
  DepthStencilCase *pDVar13;
  TestNode *pTVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  pointer pDVar18;
  char *pcVar19;
  FaceType *pFVar20;
  DepthStencilParams *pDVar21;
  undefined1 auVar22 [8];
  long lVar23;
  byte bVar24;
  float fVar25;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  cases;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  cases_2;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  subCases;
  ostringstream name;
  DepthStencilCase *local_278;
  deUint32 *local_270;
  TestNode *local_268;
  undefined8 local_260;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  local_258;
  undefined1 local_238 [8];
  undefined1 auStack_230 [8];
  undefined1 auStack_228 [52];
  undefined8 local_1f4;
  bool local_1ec;
  undefined1 local_1e0 [32];
  TestNode *local_1c0;
  anon_struct_16_2_3f885e32 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [8];
  undefined1 local_1a0 [24];
  StencilParams SStack_188;
  deUint32 dStack_16c;
  bool bStack_168;
  undefined8 local_164;
  bool local_15c;
  ios_base local_138 [264];
  
  bVar24 = 0;
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "stencil_depth_funcs","Combinations of Depth and Stencil Functions");
  local_268 = (TestNode *)this;
  local_1c0 = pTVar11;
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  lVar23 = 0;
  do {
    local_260 = (anon_struct_16_2_e828d30f *)CONCAT71(local_260._1_7_,lVar23 != 8);
    local_1b8 = init::compareFuncs + lVar23;
    local_270 = &init::compareFuncs[lVar23].func;
    pDVar13 = (DepthStencilCase *)0x0;
    do {
      local_238._0_5_ = 2;
      local_1ec = false;
      local_1f4._0_4_ = 0;
      local_1f4._4_4_ = 0;
      auStack_228[0x28] = 0;
      auStack_228._41_8_ = 0;
      auStack_228._24_4_ = 0;
      auStack_228._28_4_ = 0;
      auStack_228[0x20] = 0;
      auStack_228._33_7_ = 0;
      auStack_228._8_4_ = 0;
      auStack_228._12_4_ = 0;
      auStack_228._16_4_ = 0;
      auStack_228._20_4_ = 0;
      auStack_230 = (undefined1  [8])0x0;
      auStack_228._0_8_ = (pointer)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      lVar17 = 0xb;
      pcVar19 = "no_stencil_";
      local_278 = pDVar13;
      if (lVar23 != 8) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"stencil_",8);
        pcVar19 = local_1b8->name;
        if (pcVar19 == (char *)0x0) {
          lVar17 = 1;
          std::ios::clear((int)&local_278 +
                          (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) +
                          0xd0);
          pcVar19 = "_";
        }
        else {
          sVar12 = strlen(pcVar19);
          lVar17 = 1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,sVar12);
          pcVar19 = "_";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,lVar17);
      sVar12 = 8;
      pcVar19 = "no_depth";
      if (local_278 == (DepthStencilCase *)0x8) {
LAB_00fedfee:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,sVar12);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"depth_",6);
        pcVar19 = init::compareFuncs[(long)local_278].name;
        if (pcVar19 != (char *)0x0) {
          sVar12 = strlen(pcVar19);
          goto LAB_00fedfee;
        }
        std::ios::clear((int)&local_278 +
                        (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) +
                        0xd0);
      }
      dVar9 = 0;
      if (local_278 != (DepthStencilCase *)0x8) {
        dVar9 = init::compareFuncs[(long)local_278].func;
      }
      local_1f4 = (ulong)dVar9;
      auStack_228[0x30] = pDVar13 != (DepthStencilCase *)0x8;
      local_1ec = true;
      local_238 = (undefined1  [8])((ulong)CONCAT31(local_238._5_3_,(undefined1)local_260) << 0x20);
      local_258.
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
      ._M_impl.super__Vector_impl_data._M_finish = (DepthStencilParams *)0x0;
      local_258.
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (DepthStencilParams *)0x0;
      lVar17 = 0;
      do {
        dVar9 = 0;
        uVar7 = *(uint *)((long)&init::functionCases[0].visibleFace + lVar17);
        local_1f4 = CONCAT44(*(undefined4 *)((long)&init::functionCases[0].depth + lVar17),
                             (deUint32)local_1f4);
        local_238._0_4_ = uVar7;
        if (lVar23 != 8) {
          dVar9 = *local_270;
        }
        lVar16 = (ulong)uVar7 * 0x1c;
        *(deUint32 *)(auStack_230 + lVar16) = dVar9;
        *(undefined8 *)(auStack_230 + lVar16 + 4) =
             *(undefined8 *)((long)&init::functionCases[0].stencilRef + lVar17);
        *(undefined8 *)(auStack_228 + lVar16 + 4) =
             *(undefined8 *)((long)&init::functionCases[0].sFail + lVar17);
        *(undefined4 *)(auStack_228 + lVar16 + 0xc) =
             *(undefined4 *)((long)&init::functionCases[0].dPass + lVar17);
        *(undefined4 *)(auStack_228 + lVar16 + 0x10) =
             *(undefined4 *)((long)&init::functionCases[0].writeMask + lVar17);
        lVar16 = (ulong)((ulong)uVar7 == 0) * 0x1c;
        *(undefined8 *)(auStack_230 + lVar16) = 0x207;
        *(undefined8 *)(auStack_228 + lVar16) = 0x1e0100000000;
        *(undefined8 *)(auStack_228 + lVar16 + 8) = 0x1e0100001e01;
        *(undefined4 *)(auStack_228 + lVar16 + 0x10) = 0xffffffff;
        if (local_258.
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_258.
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
          ::
          _M_realloc_insert<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_const&>
                    ((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
                      *)&local_258,
                     (iterator)
                     local_258.
                     super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(DepthStencilParams *)local_238);
        }
        else {
          pFVar20 = (FaceType *)local_238;
          pDVar18 = local_258.
                    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (lVar16 = 0x14; lVar16 != 0; lVar16 = lVar16 + -1) {
            pDVar18->visibleFace = *pFVar20;
            pFVar20 = pFVar20 + (ulong)bVar24 * -2 + 1;
            pDVar18 = (DepthStencilParams *)((long)pDVar18 + (ulong)bVar24 * -8 + 4);
          }
          local_258.
          super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_258.
               super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar17 = lVar17 + 0x20;
      } while (lVar17 != 0x80);
      pDVar13 = (DepthStencilCase *)operator_new(0x148);
      pCVar3 = (Context *)local_268[1]._vptr_TestNode;
      std::__cxx11::stringbuf::str();
      DepthStencilCase::DepthStencilCase
                (pDVar13,pCVar3,(char *)local_1e0._0_8_,glcts::fixed_sample_locations_values + 1,
                 &local_258);
      tcu::TestNode::addChild(local_1c0,(TestNode *)pDVar13);
      if ((pointer)local_1e0._0_8_ != (pointer)(local_1e0 + 0x10)) {
        operator_delete((void *)local_1e0._0_8_,(ulong)((long)(FaceType *)local_1e0._16_8_ + 1));
      }
      pDVar13 = local_278;
      if (local_258.
          super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.
                        super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_258.
                              super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_258.
                              super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pDVar13 = (DepthStencilCase *)
                ((long)&(pDVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1);
    } while (pDVar13 != (DepthStencilCase *)0x9);
    lVar23 = lVar23 + 1;
    if (lVar23 == 9) {
      pTVar14 = (TestNode *)operator_new(0x70);
      pTVar11 = local_268;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar14,local_268->m_testCtx,"stencil_ops",
                 "Stencil Op Combinations");
      tcu::TestNode::addChild(pTVar11,pTVar14);
      lVar23 = 0;
      local_1c0 = pTVar14;
      do {
        local_260 = init::stencilOps + lVar23;
        lVar17 = 0;
        local_1b0 = lVar23;
        do {
          local_278 = (DepthStencilCase *)(init::stencilOps + lVar17);
          local_270 = (deUint32 *)0x0;
          local_1b8 = (anon_struct_16_2_3f885e32 *)lVar17;
          do {
            local_238._0_5_ = 2;
            local_1ec = false;
            local_1f4._0_4_ = 0;
            local_1f4._4_4_ = 0;
            auStack_228[0x28] = 0;
            auStack_228._41_8_ = 0;
            auStack_228._24_4_ = 0;
            auStack_228._28_4_ = 0;
            auStack_228[0x20] = 0;
            auStack_228._33_7_ = 0;
            auStack_228._8_4_ = 0;
            auStack_228._12_4_ = 0;
            auStack_228._16_4_ = 0;
            auStack_228._20_4_ = 0;
            auStack_230 = (undefined1  [8])0x0;
            auStack_228._0_8_ = (pointer)0x0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            pcVar19 = local_260->name;
            if (pcVar19 == (char *)0x0) {
              std::ios::clear((int)&local_278 +
                              (int)*(undefined8 *)
                                    (CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) + 0xd0);
            }
            else {
              sVar12 = strlen(pcVar19);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar19,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
            __s = (local_278->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode;
            if (__s == (_func_int **)0x0) {
              std::ios::clear((int)&local_278 +
                              (int)*(undefined8 *)
                                    (CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) + 0xd0);
            }
            else {
              sVar12 = strlen((char *)__s);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)__s,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
            pdVar4 = local_270;
            pcVar19 = init::stencilOps[(long)local_270].name;
            if (pcVar19 == (char *)0x0) {
              std::ios::clear((int)&local_278 +
                              (int)*(undefined8 *)
                                    (CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) + 0xd0);
            }
            else {
              sVar12 = strlen(pcVar19);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar19,sVar12);
            }
            local_1f4._0_4_ = 0x203;
            local_1f4._4_4_ = 0;
            auStack_228[0x30] = true;
            local_1ec = true;
            local_238._0_5_ = 0x100000000;
            local_258.
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_258.
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            ._M_impl.super__Vector_impl_data._M_finish = (DepthStencilParams *)0x0;
            local_258.
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (DepthStencilParams *)0x0;
            dVar9 = local_260->op;
            dVar1 = *(deUint32 *)
                     &(local_278->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
            dVar2 = init::stencilOps[(long)pdVar4].op;
            lVar23 = 0x10;
            do {
              uVar7 = *(uint *)((long)&init::functionCases[3].stencilRef + lVar23);
              local_238._0_4_ = uVar7;
              lVar17 = (ulong)uVar7 * 0x1c;
              *(undefined8 *)(auStack_230 + lVar17) =
                   *(undefined8 *)((long)&init::functionCases[3].compareMask + lVar23);
              *(deUint32 *)(auStack_228 + lVar17 + 4) = dVar9;
              *(deUint32 *)(auStack_228 + lVar17 + 8) = dVar1;
              *(deUint32 *)(auStack_228 + lVar17 + 0xc) = dVar2;
              *(undefined4 *)(auStack_228 + lVar17) =
                   *(undefined4 *)((long)&init::functionCases[3].depth + lVar23);
              *(undefined4 *)(auStack_228 + lVar17 + 0x10) =
                   *(undefined4 *)((long)&init::opCombinationCases[0].visibleFace + lVar23);
              lVar17 = (ulong)((ulong)uVar7 == 0) * 0x1c;
              *(undefined8 *)(auStack_230 + lVar17) = 0x207;
              *(undefined8 *)(auStack_228 + lVar17) = 0x1e0100000000;
              *(undefined8 *)(auStack_228 + lVar17 + 8) = 0x1e0100001e01;
              *(undefined4 *)(auStack_228 + lVar17 + 0x10) = 0xffffffff;
              if (local_258.
                  super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_258.
                  super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
                ::
                _M_realloc_insert<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_const&>
                          ((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
                            *)&local_258,
                           (iterator)
                           local_258.
                           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (DepthStencilParams *)local_238);
              }
              else {
                pFVar20 = (FaceType *)local_238;
                pDVar18 = local_258.
                          super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (lVar17 = 0x14; lVar17 != 0; lVar17 = lVar17 + -1) {
                  pDVar18->visibleFace = *pFVar20;
                  pFVar20 = pFVar20 + (ulong)bVar24 * -2 + 1;
                  pDVar18 = (DepthStencilParams *)((long)pDVar18 + (ulong)bVar24 * -8 + 4);
                }
                local_258.
                super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_258.
                     super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              lVar23 = lVar23 + 0x14;
            } while (lVar23 != 0x60);
            pDVar13 = (DepthStencilCase *)operator_new(0x148);
            pTVar11 = local_268;
            pCVar3 = (Context *)local_268[1]._vptr_TestNode;
            std::__cxx11::stringbuf::str();
            DepthStencilCase::DepthStencilCase
                      (pDVar13,pCVar3,(char *)local_1e0._0_8_,
                       glcts::fixed_sample_locations_values + 1,&local_258);
            tcu::TestNode::addChild(local_1c0,(TestNode *)pDVar13);
            if ((pointer)local_1e0._0_8_ != (pointer)(local_1e0 + 0x10)) {
              operator_delete((void *)local_1e0._0_8_,
                              (ulong)((long)(FaceType *)local_1e0._16_8_ + 1));
            }
            if (local_258.
                super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_258.
                              super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_258.
                                    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_258.
                                    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            local_270 = (deUint32 *)((long)local_270 + 1);
          } while (local_270 != (deUint32 *)0x8);
          lVar17 = (long)local_1b8 + 1;
        } while (lVar17 != 8);
        lVar23 = local_1b0 + 1;
      } while (lVar23 != 8);
      pTVar14 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar14,pTVar11->m_testCtx,"write_mask",
                 "Depth and Stencil Write Masks");
      tcu::TestNode::addChild(pTVar11,pTVar14);
      local_164 = 0x203;
      bStack_168 = true;
      local_1a8[4] = true;
      local_1a0._0_4_ = 0x205;
      local_1a0._4_4_ = 1;
      local_1a0._8_4_ = 0xffffffff;
      local_1a0._12_4_ = 0x150a;
      local_1a0._16_4_ = 0x1e02;
      local_1a0._20_4_ = 0x1e03;
      SStack_188.function = 0xffffffff;
      SStack_188.reference = 0x207;
      SStack_188.compareMask = 0;
      SStack_188.stencilFailOp = 0xffffffff;
      SStack_188.depthFailOp._0_1_ = 1;
      SStack_188._17_7_ = 0x150a00001e;
      SStack_188.writeMask = 0x1e02;
      dStack_16c = 0xffffffff;
      local_238 = (undefined1  [8])0x0;
      auStack_230 = (undefined1  [8])0x0;
      auStack_228._0_8_ = (DepthStencilParams *)0x0;
      local_1a8._0_4_ = FACETYPE_FRONT;
      local_15c = true;
      std::
      vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
      ::_M_realloc_insert<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_const&>
                ((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
                  *)local_238,(iterator)0x0,(DepthStencilParams *)local_1a8);
      local_1a8._0_4_ = FACETYPE_FRONT;
      local_15c = false;
      if (auStack_230 == (undefined1  [8])auStack_228._0_8_) {
        std::
        vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
        ::
        _M_realloc_insert<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_const&>
                  ((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
                    *)local_238,(iterator)auStack_230,(DepthStencilParams *)local_1a8);
      }
      else {
        pFVar20 = (FaceType *)local_1a8;
        auVar22 = auStack_230;
        for (lVar23 = 0x14; lVar23 != 0; lVar23 = lVar23 + -1) {
          ((DepthStencilParams *)auVar22)->visibleFace = *pFVar20;
          pFVar20 = pFVar20 + (ulong)bVar24 * -2 + 1;
          auVar22 = (undefined1  [8])((long)auVar22 + (ulong)bVar24 * -8 + 4);
        }
        auStack_230 = (undefined1  [8])((long)auStack_230 + 0x50);
      }
      local_1a8._0_4_ = FACETYPE_BACK;
      local_15c = true;
      if (auStack_230 == (undefined1  [8])auStack_228._0_8_) {
        std::
        vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
        ::
        _M_realloc_insert<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_const&>
                  ((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
                    *)local_238,(iterator)auStack_230,(DepthStencilParams *)local_1a8);
      }
      else {
        pFVar20 = (FaceType *)local_1a8;
        auVar22 = auStack_230;
        for (lVar23 = 0x14; lVar23 != 0; lVar23 = lVar23 + -1) {
          ((DepthStencilParams *)auVar22)->visibleFace = *pFVar20;
          pFVar20 = pFVar20 + (ulong)bVar24 * -2 + 1;
          auVar22 = (undefined1  [8])((long)auVar22 + (ulong)bVar24 * -8 + 4);
        }
        auStack_230 = (undefined1  [8])((long)auStack_230 + 0x50);
      }
      local_1a8._0_4_ = FACETYPE_BACK;
      local_15c = false;
      if (auStack_230 == (undefined1  [8])auStack_228._0_8_) {
        std::
        vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
        ::
        _M_realloc_insert<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_const&>
                  ((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
                    *)local_238,(iterator)auStack_230,(DepthStencilParams *)local_1a8);
      }
      else {
        pFVar20 = (FaceType *)local_1a8;
        auVar22 = auStack_230;
        for (lVar23 = 0x14; lVar23 != 0; lVar23 = lVar23 + -1) {
          ((DepthStencilParams *)auVar22)->visibleFace = *pFVar20;
          pFVar20 = pFVar20 + (ulong)bVar24 * -2 + 1;
          auVar22 = (undefined1  [8])((long)auVar22 + (ulong)bVar24 * -8 + 4);
        }
        auStack_230 = (undefined1  [8])((long)auStack_230 + 0x50);
      }
      pDVar13 = (DepthStencilCase *)operator_new(0x148);
      DepthStencilCase::DepthStencilCase
                (pDVar13,(Context *)pTVar11[1]._vptr_TestNode,"depth","Depth Write Mask",
                 (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                  *)local_238);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pDVar13);
      if (local_238 != (undefined1  [8])0x0) {
        operator_delete((void *)local_238,auStack_228._0_8_ - (long)local_238);
      }
      local_164 = 0x203;
      bStack_168 = true;
      local_15c = true;
      local_1a8[4] = true;
      local_1a0._0_4_ = 0x205;
      local_1a0._4_4_ = 1;
      local_1a0._8_4_ = 0xffffffff;
      local_1a0._12_4_ = 0x150a;
      local_1a0._16_4_ = 0x1e02;
      local_1a0._20_4_ = 0x1e03;
      SStack_188.function = 0;
      SStack_188.reference = 0x207;
      SStack_188.compareMask = 0;
      SStack_188.stencilFailOp = 0xffffffff;
      SStack_188.depthFailOp._0_1_ = 1;
      SStack_188._17_7_ = 0x150a00001e;
      SStack_188.writeMask = 0x1e02;
      local_238 = (undefined1  [8])0x0;
      auStack_230 = (undefined1  [8])0x0;
      auStack_228._0_8_ = (DepthStencilParams *)0x0;
      lVar23 = 8;
      do {
        local_1a8._0_4_ = *(FaceType *)((long)&init::opCombinationCases[3].compareMask + lVar23);
        SStack_188.function = *(deUint32 *)((long)&init::opCombinationCases[3].writeMask + lVar23);
        dStack_16c = *(deUint32 *)((long)&init::stencilWmaskCases[0].visibleFace + lVar23);
        if (auStack_230 == (undefined1  [8])auStack_228._0_8_) {
          std::
          vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
          ::
          _M_realloc_insert<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_const&>
                    ((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
                      *)local_238,(iterator)auStack_230,(DepthStencilParams *)local_1a8);
        }
        else {
          pDVar21 = (DepthStencilParams *)local_1a8;
          auVar22 = auStack_230;
          for (lVar17 = 0x14; lVar17 != 0; lVar17 = lVar17 + -1) {
            ((DepthStencilParams *)auVar22)->visibleFace = pDVar21->visibleFace;
            pDVar21 = (DepthStencilParams *)((long)pDVar21 + (ulong)bVar24 * -8 + 4);
            auVar22 = (undefined1  [8])((long)auVar22 + (ulong)bVar24 * -8 + 4);
          }
          auStack_230 = (undefined1  [8])((long)auStack_230 + 0x50);
        }
        lVar23 = lVar23 + 0xc;
      } while (lVar23 != 0x68);
      pDVar13 = (DepthStencilCase *)operator_new(0x148);
      DepthStencilCase::DepthStencilCase
                (pDVar13,(Context *)local_268[1]._vptr_TestNode,"stencil","Stencil Write Mask",
                 (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                  *)local_238);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pDVar13);
      if (local_238 != (undefined1  [8])0x0) {
        operator_delete((void *)local_238,auStack_228._0_8_ - (long)local_238);
      }
      local_164 = 0x203;
      bStack_168 = true;
      local_1a8[4] = true;
      local_1a0._0_4_ = 0x205;
      local_1a0._4_4_ = 1;
      local_1a0._8_4_ = 0xffffffff;
      local_1a0._12_4_ = 0x150a;
      local_1a0._16_4_ = 0x1e02;
      local_1a0._20_4_ = 0x1e03;
      SStack_188.function = 0;
      SStack_188.reference = 0x207;
      SStack_188.compareMask = 0;
      SStack_188.stencilFailOp = 0xffffffff;
      SStack_188.depthFailOp._0_1_ = 1;
      SStack_188._17_7_ = 0x150a00001e;
      SStack_188.writeMask = 0x1e02;
      local_238 = (undefined1  [8])0x0;
      auStack_230 = (undefined1  [8])0x0;
      auStack_228._0_8_ = (DepthStencilParams *)0x0;
      lVar23 = 0xc;
      do {
        local_15c = (bool)*(undefined1 *)((long)&init::stencilWmaskCases[7].visibleFace + lVar23);
        local_1a8._0_4_ = *(float *)((long)&init::stencilWmaskCases[7].frontWriteMask + lVar23);
        SStack_188.function =
             *(deUint32 *)((long)&init::stencilWmaskCases[7].backWriteMask + lVar23);
        dStack_16c = *(deUint32 *)(&init::depthStencilWmaskCases[0].depthWriteMask + lVar23);
        if (auStack_230 == (undefined1  [8])auStack_228._0_8_) {
          std::
          vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
          ::
          _M_realloc_insert<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_const&>
                    ((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>>
                      *)local_238,(iterator)auStack_230,(DepthStencilParams *)local_1a8);
        }
        else {
          pDVar21 = (DepthStencilParams *)local_1a8;
          auVar22 = auStack_230;
          for (lVar17 = 0x14; lVar17 != 0; lVar17 = lVar17 + -1) {
            ((DepthStencilParams *)auVar22)->visibleFace = pDVar21->visibleFace;
            pDVar21 = (DepthStencilParams *)((long)pDVar21 + (ulong)bVar24 * -8 + 4);
            auVar22 = (undefined1  [8])((long)auVar22 + (ulong)bVar24 * -8 + 4);
          }
          auStack_230 = (undefined1  [8])((long)auStack_230 + 0x50);
        }
        lVar23 = lVar23 + 0x10;
      } while (lVar23 != 0xcc);
      pDVar13 = (DepthStencilCase *)operator_new(0x148);
      pTVar11 = local_268;
      DepthStencilCase::DepthStencilCase
                (pDVar13,(Context *)local_268[1]._vptr_TestNode,"both",
                 "Depth and Stencil Write Masks",
                 (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                  *)local_238);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pDVar13);
      if (local_238 != (undefined1  [8])0x0) {
        operator_delete((void *)local_238,auStack_228._0_8_ - (long)local_238);
      }
      pTVar14 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar14,pTVar11->m_testCtx,"random",
                 "Randomized Depth and Stencil Test Cases");
      tcu::TestNode::addChild(pTVar11,pTVar14);
      local_270 = (deUint32 *)((ulong)local_270 & 0xffffffff00000000);
      local_1c0 = pTVar14;
      do {
        std::
        vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
        ::vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                  *)local_1e0,10,(allocator_type *)local_1a8);
        uVar6 = tcu::CommandLine::getBaseSeed(local_268->m_testCtx->m_cmdLine);
        uVar7 = ((uint)local_270 >> 0x10 ^ (uint)local_270 ^ 0x3d) * 9;
        uVar6 = (uVar6 >> 0x10 ^ uVar6 ^ 0x3d) * 9;
        uVar7 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d ^ (uVar7 >> 4 ^ uVar7) * 0x27d4eb2d;
        deRandom_init((deRandom *)&local_258,uVar7 >> 0xf ^ uVar7);
        for (pDVar18 = (pointer)local_1e0._0_8_; pDVar18 != (pointer)local_1e0._8_8_;
            pDVar18 = pDVar18 + 1) {
          dVar8 = deRandom_getBool((deRandom *)&local_258);
          pDVar18->visibleFace = (uint)(dVar8 != 1);
          fVar25 = deRandom_getFloat((deRandom *)&local_258);
          pDVar18->stencilTestEnabled = fVar25 < 0.8;
          bVar5 = true;
          if (fVar25 < 0.8) {
            fVar25 = deRandom_getFloat((deRandom *)&local_258);
            bVar5 = fVar25 < 0.7;
          }
          pDVar18->depthTestEnabled = bVar5;
          if (pDVar18->stencilTestEnabled == true) {
            lVar23 = 0x20;
            do {
              local_1a8._0_4_ = FACETYPE_FRONT;
              de::Random::choose<unsigned_int_const*,unsigned_int*>
                        ((Random *)&local_258,
                         (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                 ::compareFuncs,
                         (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                 ::stencilOps,(uint *)local_1a8,1);
              *(undefined4 *)((long)pDVar18->stencil + lVar23 + -0x20) = local_1a8._0_4_;
              dVar9 = deRandom_getUint32((deRandom *)&local_258);
              *(uint *)((long)(pDVar18->stencil + -1) + lVar23) = dVar9 % 0x107 - 2;
              dVar9 = deRandom_getUint32((deRandom *)&local_258);
              *(deUint32 *)((long)pDVar18->stencil + lVar23 + -0x18) = dVar9;
              local_1a8._0_4_ = FACETYPE_FRONT;
              de::Random::choose<unsigned_int_const*,unsigned_int*>
                        ((Random *)&local_258,
                         (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                 ::stencilOps,
                         (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                 ::depthValues,(uint *)local_1a8,1);
              *(undefined4 *)((long)pDVar18->stencil + lVar23 + -0x14) = local_1a8._0_4_;
              local_1a8._0_4_ = FACETYPE_FRONT;
              de::Random::choose<unsigned_int_const*,unsigned_int*>
                        ((Random *)&local_258,
                         (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                 ::stencilOps,
                         (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                 ::depthValues,(uint *)local_1a8,1);
              *(undefined4 *)((long)pDVar18->stencil + lVar23 + -0x10) = local_1a8._0_4_;
              local_1a8._0_4_ = 0.0;
              de::Random::choose<unsigned_int_const*,unsigned_int*>
                        ((Random *)&local_258,
                         (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                 ::stencilOps,
                         (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                 ::depthValues,(uint *)local_1a8,1);
              *(undefined4 *)((long)pDVar18->stencil + lVar23 + -0xc) = local_1a8._0_4_;
              dVar9 = deRandom_getUint32((deRandom *)&local_258);
              *(deUint32 *)((long)pDVar18->stencil + lVar23 + -8) = dVar9;
              lVar23 = lVar23 + 0x1c;
            } while (lVar23 == 0x3c);
          }
          if (pDVar18->depthTestEnabled == true) {
            local_1a8._0_4_ = FACETYPE_FRONT;
            de::Random::choose<unsigned_int_const*,unsigned_int*>
                      ((Random *)&local_258,
                       (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                               ::compareFuncs,
                       (uint *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                               ::stencilOps,(uint *)local_1a8,1);
            pDVar18->depthFunc = local_1a8._0_4_;
            local_1a8._0_4_ = 0.0;
            de::Random::choose<float_const*,float*>
                      ((Random *)&local_258,
                       (float *)randomDepthStencilState(de::Random&,deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams&)
                                ::depthValues,(float *)"Error code mismatch: got ",
                       (float *)local_1a8,1);
            pDVar18->depth = (float)local_1a8._0_4_;
            dVar8 = deRandom_getBool((deRandom *)&local_258);
            pDVar18->depthWriteMask = dVar8 == 1;
          }
        }
        local_278 = (DepthStencilCase *)operator_new(0x148);
        pCVar3 = (Context *)local_268[1]._vptr_TestNode;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<((ostringstream *)local_1a8,(uint)local_270);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        uVar15 = std::ios_base::~ios_base(local_138);
        pDVar13 = local_278;
        local_260._0_4_ = (int)CONCAT71((int7)((ulong)uVar15 >> 8),1);
        DepthStencilCase::DepthStencilCase
                  (local_278,pCVar3,(char *)local_238,glcts::fixed_sample_locations_values + 1,
                   (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                    *)local_1e0);
        local_260 = (anon_struct_16_2_e828d30f *)((ulong)local_260._4_4_ << 0x20);
        tcu::TestNode::addChild(local_1c0,(TestNode *)pDVar13);
        if (local_238 != (undefined1  [8])auStack_228) {
          operator_delete((void *)local_238,(ulong)((long)(FaceType *)auStack_228._0_8_ + 1));
        }
        if ((pointer)local_1e0._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ - local_1e0._0_8_);
        }
        iVar10 = (uint)local_270 + 1;
        local_270 = (deUint32 *)CONCAT44(local_270._4_4_,iVar10);
      } while (iVar10 != 0x19);
      return 0x19;
    }
  } while( true );
}

Assistant:

void DepthStencilTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	func;
	} compareFuncs[] =
	{
		{ "never",		GL_NEVER	},
		{ "always",		GL_ALWAYS	},
		{ "less",		GL_LESS		},
		{ "lequal",		GL_LEQUAL	},
		{ "equal",		GL_EQUAL	},
		{ "gequal",		GL_GEQUAL	},
		{ "greater",	GL_GREATER	},
		{ "notequal",	GL_NOTEQUAL	}
	};

	static const struct
	{
		const char*	name;
		deUint32	op;
	} stencilOps[] =
	{
		{ "keep",		GL_KEEP			},
		{ "zero",		GL_ZERO			},
		{ "replace",	GL_REPLACE		},
		{ "incr",		GL_INCR			},
		{ "decr",		GL_DECR			},
		{ "invert",		GL_INVERT		},
		{ "incr_wrap",	GL_INCR_WRAP	},
		{ "decr_wrap",	GL_DECR_WRAP	}
	};

	static const struct
	{
		rr::FaceType	visibleFace;
		deUint32		sFail;
		deUint32		dFail;
		deUint32		dPass;
		int				stencilRef;
		deUint32		compareMask;
		deUint32		writeMask;
		float			depth;
	} functionCases[] =
	{
		{ rr::FACETYPE_BACK,	GL_DECR,		GL_INCR,	GL_INVERT,		4,	~0u, ~0u,	-0.7f },
		{ rr::FACETYPE_FRONT,	GL_DECR,		GL_INCR,	GL_INVERT,		2,	~0u, ~0u,	0.0f },
		{ rr::FACETYPE_BACK,	GL_DECR,		GL_INCR,	GL_INVERT,		1,	~0u, ~0u,	0.2f },
		{ rr::FACETYPE_FRONT,	GL_DECR_WRAP,	GL_INVERT,	GL_REPLACE,		4,	~0u, ~0u,	1.0f }
	};

	// All combinations of depth stencil functions.
	{
		tcu::TestCaseGroup* functionsGroup = new tcu::TestCaseGroup(m_testCtx, "stencil_depth_funcs", "Combinations of Depth and Stencil Functions");
		addChild(functionsGroup);

		for (int stencilFunc = 0; stencilFunc < DE_LENGTH_OF_ARRAY(compareFuncs)+1; stencilFunc++)
		{
			// One extra: depth test disabled.
			for (int depthFunc = 0; depthFunc < DE_LENGTH_OF_ARRAY(compareFuncs)+1; depthFunc++)
			{
				DepthStencilParams	params;
				ostringstream		name;
				bool				hasStencilFunc	= de::inBounds(stencilFunc, 0, DE_LENGTH_OF_ARRAY(compareFuncs));
				bool				hasDepthFunc	= de::inBounds(depthFunc, 0, DE_LENGTH_OF_ARRAY(compareFuncs));

				if (hasStencilFunc)
					name << "stencil_" << compareFuncs[stencilFunc].name << "_";
				else
					name << "no_stencil_";

				if (hasDepthFunc)
					name << "depth_" << compareFuncs[depthFunc].name;
				else
					name << "no_depth";

				params.depthFunc			= hasDepthFunc ? compareFuncs[depthFunc].func : 0;
				params.depthTestEnabled		= hasDepthFunc;
				params.depthWriteMask		= true;

				params.stencilTestEnabled	= hasStencilFunc;

				vector<DepthStencilParams> cases;
				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(functionCases); ndx++)
				{
					rr::FaceType	visible		= functionCases[ndx].visibleFace;
					rr::FaceType	notVisible	= visible == rr::FACETYPE_FRONT ? rr::FACETYPE_BACK : rr::FACETYPE_FRONT;

					params.depth								= functionCases[ndx].depth;
					params.visibleFace							= visible;

					params.stencil[visible].function			= hasStencilFunc ? compareFuncs[stencilFunc].func : 0;
					params.stencil[visible].reference			= functionCases[ndx].stencilRef;
					params.stencil[visible].stencilFailOp		= functionCases[ndx].sFail;
					params.stencil[visible].depthFailOp			= functionCases[ndx].dFail;
					params.stencil[visible].depthPassOp			= functionCases[ndx].dPass;
					params.stencil[visible].compareMask			= functionCases[ndx].compareMask;
					params.stencil[visible].writeMask			= functionCases[ndx].writeMask;

					params.stencil[notVisible].function			= GL_ALWAYS;
					params.stencil[notVisible].reference		= 0;
					params.stencil[notVisible].stencilFailOp	= GL_REPLACE;
					params.stencil[notVisible].depthFailOp		= GL_REPLACE;
					params.stencil[notVisible].depthPassOp		= GL_REPLACE;
					params.stencil[notVisible].compareMask		= 0u;
					params.stencil[notVisible].writeMask		= ~0u;


					cases.push_back(params);
				}

				functionsGroup->addChild(new DepthStencilCase(m_context, name.str().c_str(), "", cases));
			}
		}
	}

	static const struct
	{
		rr::FaceType	visibleFace;
		deUint32		func;
		int				ref;
		deUint32		compareMask;
		deUint32		writeMask;
	} opCombinationCases[] =
	{
		{ rr::FACETYPE_BACK,	GL_LESS,		4,		~0u,	~0u	},
		{ rr::FACETYPE_FRONT,	GL_GREATER,		2,		~0u,	~0u	},
		{ rr::FACETYPE_BACK,	GL_EQUAL,		3,		~2u,	~0u	},
		{ rr::FACETYPE_FRONT,	GL_NOTEQUAL,	1,		~0u,	~1u	}
	};

	// All combinations of stencil ops.
	{
		tcu::TestCaseGroup* opCombinationGroup = new tcu::TestCaseGroup(m_testCtx, "stencil_ops", "Stencil Op Combinations");
		addChild(opCombinationGroup);

		for (int sFail = 0; sFail < DE_LENGTH_OF_ARRAY(stencilOps); sFail++)
		{
			for (int dFail = 0; dFail < DE_LENGTH_OF_ARRAY(stencilOps); dFail++)
			{
				for (int dPass = 0; dPass < DE_LENGTH_OF_ARRAY(stencilOps); dPass++)
				{
					DepthStencilParams	params;
					ostringstream		name;

					name << stencilOps[sFail].name << "_" << stencilOps[dFail].name << "_" << stencilOps[dPass].name;

					params.depthFunc			= GL_LEQUAL;
					params.depth				= 0.0f;
					params.depthTestEnabled		= true;
					params.depthWriteMask		= true;

					params.stencilTestEnabled	= true;

					vector<DepthStencilParams> cases;
					for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(opCombinationCases); ndx++)
					{
						rr::FaceType	visible		= opCombinationCases[ndx].visibleFace;
						rr::FaceType	notVisible	= visible == rr::FACETYPE_FRONT ? rr::FACETYPE_BACK : rr::FACETYPE_FRONT;

						params.visibleFace							= visible;

						params.stencil[visible].function			= opCombinationCases[ndx].func;
						params.stencil[visible].reference			= opCombinationCases[ndx].ref;
						params.stencil[visible].stencilFailOp		= stencilOps[sFail].op;
						params.stencil[visible].depthFailOp			= stencilOps[dFail].op;
						params.stencil[visible].depthPassOp			= stencilOps[dPass].op;
						params.stencil[visible].compareMask			= opCombinationCases[ndx].compareMask;
						params.stencil[visible].writeMask			= opCombinationCases[ndx].writeMask;

						params.stencil[notVisible].function			= GL_ALWAYS;
						params.stencil[notVisible].reference		= 0;
						params.stencil[notVisible].stencilFailOp	= GL_REPLACE;
						params.stencil[notVisible].depthFailOp		= GL_REPLACE;
						params.stencil[notVisible].depthPassOp		= GL_REPLACE;
						params.stencil[notVisible].compareMask		= 0u;
						params.stencil[notVisible].writeMask		= ~0u;


						cases.push_back(params);
					}

					opCombinationGroup->addChild(new DepthStencilCase(m_context, name.str().c_str(), "", cases));
				}
			}
		}
	}

	// Write masks
	{
		tcu::TestCaseGroup* writeMaskGroup = new tcu::TestCaseGroup(m_testCtx, "write_mask", "Depth and Stencil Write Masks");
		addChild(writeMaskGroup);

		// Depth mask
		{
			DepthStencilParams params;

			params.depthFunc			= GL_LEQUAL;
			params.depth				= 0.0f;
			params.depthTestEnabled		= true;
			params.stencilTestEnabled	= true;

			params.stencil[rr::FACETYPE_FRONT].function			= GL_NOTEQUAL;
			params.stencil[rr::FACETYPE_FRONT].reference		= 1;
			params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_INVERT;
			params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_INCR;
			params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_DECR;
			params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;
			params.stencil[rr::FACETYPE_FRONT].writeMask		= ~0u;

			params.stencil[rr::FACETYPE_BACK].function			= GL_ALWAYS;
			params.stencil[rr::FACETYPE_BACK].reference			= 0;
			params.stencil[rr::FACETYPE_BACK].stencilFailOp		= GL_REPLACE;
			params.stencil[rr::FACETYPE_BACK].depthFailOp		= GL_INVERT;
			params.stencil[rr::FACETYPE_BACK].depthPassOp		= GL_INCR;
			params.stencil[rr::FACETYPE_BACK].compareMask		= ~0u;
			params.stencil[rr::FACETYPE_BACK].writeMask			= ~0u;

			vector<DepthStencilParams> cases;

			// Case 1: front, depth write enabled
			params.visibleFace		= rr::FACETYPE_FRONT;
			params.depthWriteMask	= true;
			cases.push_back(params);

			// Case 2: front, depth write disabled
			params.visibleFace		= rr::FACETYPE_FRONT;
			params.depthWriteMask	= false;
			cases.push_back(params);

			// Case 3: back, depth write enabled
			params.visibleFace		= rr::FACETYPE_BACK;
			params.depthWriteMask	= true;
			cases.push_back(params);

			// Case 4: back, depth write disabled
			params.visibleFace		= rr::FACETYPE_BACK;
			params.depthWriteMask	= false;
			cases.push_back(params);

			writeMaskGroup->addChild(new DepthStencilCase(m_context, "depth", "Depth Write Mask", cases));
		}

		// Stencil write masks.
		{
			static const struct
			{
				rr::FaceType	visibleFace;
				deUint32		frontWriteMask;
				deUint32		backWriteMask;
			} stencilWmaskCases[] =
			{
				{ rr::FACETYPE_FRONT,	~0u,	0u		},
				{ rr::FACETYPE_FRONT,	0u,		~0u		},
				{ rr::FACETYPE_FRONT,	0xfu,	0xf0u	},
				{ rr::FACETYPE_FRONT,	0x2u,	0x4u	},
				{ rr::FACETYPE_BACK,	0u,		~0u		},
				{ rr::FACETYPE_BACK,	~0u,	0u		},
				{ rr::FACETYPE_BACK,	0xf0u,	0xfu	},
				{ rr::FACETYPE_BACK,	0x4u,	0x2u	}
			};

			DepthStencilParams params;

			params.depthFunc			= GL_LEQUAL;
			params.depth				= 0.0f;
			params.depthTestEnabled		= true;
			params.depthWriteMask		= true;
			params.stencilTestEnabled	= true;

			params.stencil[rr::FACETYPE_FRONT].function			= GL_NOTEQUAL;
			params.stencil[rr::FACETYPE_FRONT].reference		= 1;
			params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_INVERT;
			params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_INCR;
			params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_DECR;
			params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;

			params.stencil[rr::FACETYPE_BACK].function			= GL_ALWAYS;
			params.stencil[rr::FACETYPE_BACK].reference			= 0;
			params.stencil[rr::FACETYPE_BACK].stencilFailOp		= GL_REPLACE;
			params.stencil[rr::FACETYPE_BACK].depthFailOp		= GL_INVERT;
			params.stencil[rr::FACETYPE_BACK].depthPassOp		= GL_INCR;
			params.stencil[rr::FACETYPE_BACK].compareMask		= ~0u;

			vector<DepthStencilParams> cases;
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilWmaskCases); ndx++)
			{
				params.visibleFace								= stencilWmaskCases[ndx].visibleFace;
				params.stencil[rr::FACETYPE_FRONT].writeMask	= stencilWmaskCases[ndx].frontWriteMask;
				params.stencil[rr::FACETYPE_BACK].writeMask		= stencilWmaskCases[ndx].backWriteMask;
				cases.push_back(params);
			}

			writeMaskGroup->addChild(new DepthStencilCase(m_context, "stencil", "Stencil Write Mask", cases));
		}

		// Depth & stencil write masks.
		{
			static const struct
			{
				bool			depthWriteMask;
				rr::FaceType	visibleFace;
				deUint32		frontWriteMask;
				deUint32		backWriteMask;
			} depthStencilWmaskCases[] =
			{
				{ false,	rr::FACETYPE_FRONT,		~0u,	0u		},
				{ false,	rr::FACETYPE_FRONT,		0u,		~0u		},
				{ false,	rr::FACETYPE_FRONT,		0xfu,	0xf0u	},
				{ true,		rr::FACETYPE_FRONT,		~0u,	0u		},
				{ true,		rr::FACETYPE_FRONT,		0u,		~0u		},
				{ true,		rr::FACETYPE_FRONT,		0xfu,	0xf0u	},
				{ false,	rr::FACETYPE_BACK,		0u,		~0u		},
				{ false,	rr::FACETYPE_BACK,		~0u,	0u		},
				{ false,	rr::FACETYPE_BACK,		0xf0u,	0xfu	},
				{ true,		rr::FACETYPE_BACK,		0u,		~0u		},
				{ true,		rr::FACETYPE_BACK,		~0u,	0u		},
				{ true,		rr::FACETYPE_BACK,		0xf0u,	0xfu	}
			};

			DepthStencilParams params;

			params.depthFunc			= GL_LEQUAL;
			params.depth				= 0.0f;
			params.depthTestEnabled		= true;
			params.depthWriteMask		= true;
			params.stencilTestEnabled	= true;

			params.stencil[rr::FACETYPE_FRONT].function			= GL_NOTEQUAL;
			params.stencil[rr::FACETYPE_FRONT].reference		= 1;
			params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_INVERT;
			params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_INCR;
			params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_DECR;
			params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;

			params.stencil[rr::FACETYPE_BACK].function			= GL_ALWAYS;
			params.stencil[rr::FACETYPE_BACK].reference			= 0;
			params.stencil[rr::FACETYPE_BACK].stencilFailOp		= GL_REPLACE;
			params.stencil[rr::FACETYPE_BACK].depthFailOp		= GL_INVERT;
			params.stencil[rr::FACETYPE_BACK].depthPassOp		= GL_INCR;
			params.stencil[rr::FACETYPE_BACK].compareMask		= ~0u;

			vector<DepthStencilParams> cases;
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilWmaskCases); ndx++)
			{
				params.depthWriteMask							= depthStencilWmaskCases[ndx].depthWriteMask;
				params.visibleFace								= depthStencilWmaskCases[ndx].visibleFace;
				params.stencil[rr::FACETYPE_FRONT].writeMask	= depthStencilWmaskCases[ndx].frontWriteMask;
				params.stencil[rr::FACETYPE_BACK].writeMask		= depthStencilWmaskCases[ndx].backWriteMask;
				cases.push_back(params);
			}

			writeMaskGroup->addChild(new DepthStencilCase(m_context, "both", "Depth and Stencil Write Masks", cases));
		}
	}

	// Randomized cases
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized Depth and Stencil Test Cases");
		addChild(randomGroup);

		for (int caseNdx = 0; caseNdx < NUM_RANDOM_CASES; caseNdx++)
		{
			vector<DepthStencilParams>	subCases	(NUM_RANDOM_SUB_CASES);
			de::Random					rnd			(deInt32Hash(caseNdx) ^ deInt32Hash(m_testCtx.getCommandLine().getBaseSeed()));

			for (vector<DepthStencilParams>::iterator iter = subCases.begin(); iter != subCases.end(); ++iter)
				randomDepthStencilState(rnd, *iter);

			randomGroup->addChild(new DepthStencilCase(m_context, de::toString(caseNdx).c_str(), "", subCases));
		}
	}
}